

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O2

string * __thiscall
pfederc::BiOpExpr::toString_abi_cxx11_(string *__return_storage_ptr__,BiOpExpr *this)

{
  Lexer *expr;
  BiOpExpr *pBVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  BiOpExpr *biopexpr;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *puVar3;
  string args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  BiOpExpr *local_e0;
  string *local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (this->opType - 0x2f < 3) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    (*((this->lhs)._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
       _M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
       super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl)->_vptr_Expr[2])(&args);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&args);
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    args._M_dataplus._M_p = (pointer)&args.field_2;
    args._M_string_length = 0;
    args.field_2._M_local_buf[0] = '\0';
    puVar3 = &this->rhs;
    local_e0 = this;
    local_d8 = __return_storage_ptr__;
    while( true ) {
      expr = (Lexer *)(puVar3->_M_t).
                      super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t
                      .super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
                      super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
      bVar2 = isBiOpExpr((Expr *)expr,TOK_OP_COMMA);
      if (!bVar2) break;
      (**(code **)(**(long **)&((Expr *)&expr->fileContent)->type + 0x10))(&local_d0);
      std::operator+(&local_100,' ',&local_d0);
      std::operator+(&local_120,&local_100,&args);
      std::__cxx11::string::operator=((string *)&args,(string *)&local_120);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_d0);
      puVar3 = (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
               &((Expr *)&expr->fileContent)->lexer;
    }
    (*expr->_vptr_Lexer[2])(&local_100,expr);
    std::operator+(&local_120,&local_100,&args);
    __return_storage_ptr__ = local_d8;
    pBVar1 = local_e0;
    std::__cxx11::string::operator=((string *)&args,(string *)&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    if ((ushort)((short)*(undefined4 *)&pBVar1->opType - 0x2fU) < 3) {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_120,"Unexpected branch reached",(allocator<char> *)&local_100);
      fatal("expr.cpp",0x34a,&local_120);
      std::__cxx11::string::~string((string *)&local_120);
    }
    this_00 = &args;
  }
  else if (this->opType == TOK_OP_NONE) {
    (*((this->lhs)._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
       _M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
       super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl)->_vptr_Expr[2])(&local_d0);
    std::operator+(&local_100,"( ",&local_d0);
    std::operator+(&local_120,&local_100,' ');
    (*((this->rhs)._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
       _M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
       super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl)->_vptr_Expr[2])(&local_b0);
    std::operator+(&args,&local_120,&local_b0);
    std::operator+(__return_storage_ptr__,&args,')');
    std::__cxx11::string::~string((string *)&args);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_100);
    this_00 = &local_d0;
  }
  else {
    (*this->tokOp->_vptr_Token[2])(&local_50,this->tokOp,(this->super_Expr).lexer);
    std::operator+(&local_b0,'(',&local_50);
    std::operator+(&local_d0,&local_b0,' ');
    (*((this->lhs)._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
       _M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
       super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl)->_vptr_Expr[2])(&local_70);
    std::operator+(&local_100,&local_d0,&local_70);
    std::operator+(&local_120,&local_100,' ');
    (*((this->rhs)._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
       _M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
       super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl)->_vptr_Expr[2])(&local_90);
    std::operator+(&args,&local_120,&local_90);
    std::operator+(__return_storage_ptr__,&args,')');
    std::__cxx11::string::~string((string *)&args);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_b0);
    this_00 = &local_50;
  }
  std::__cxx11::string::~string((string *)this_00);
  return __return_storage_ptr__;
}

Assistant:

std::string BiOpExpr::toString() const noexcept {
  switch (getOperatorType()) {
  case TokenType::TOK_OP_BRACKET_OPEN:
  case TokenType::TOK_OP_ARR_BRACKET_OPEN:
  case TokenType::TOK_OP_TEMPL_BRACKET_OPEN: {
    std::string result;
    switch (getOperatorType()) {
      case TokenType::TOK_OP_BRACKET_OPEN:
        result += '(';
        break;
      case TokenType::TOK_OP_ARR_BRACKET_OPEN:
        result += '[';
        break;
      case TokenType::TOK_OP_TEMPL_BRACKET_OPEN:
        result += '{';
        break;
      default:
        fatal("expr.cpp", __LINE__, "Unexpected branch reached");
        break;
    }
    result += getLeft().toString();
    result += ' ';
    std::string args;
    const Expr * expr = &getRight();
    while (isBiOpExpr(*expr, TokenType::TOK_OP_COMMA)) {
      const BiOpExpr * biopexpr = dynamic_cast<const BiOpExpr*>(expr);
      args = ' ' + biopexpr->getRight().toString() + args;
      expr = &biopexpr->getLeft();
    }

    args = expr->toString() + args;
    result += args;
    switch (getOperatorType()) {
      case TokenType::TOK_OP_BRACKET_OPEN:
        result += ')';
        break;
      case TokenType::TOK_OP_ARR_BRACKET_OPEN:
        result += ']';
        break;
      case TokenType::TOK_OP_TEMPL_BRACKET_OPEN:
        result += '}';
        break;
      default:
        fatal("expr.cpp", __LINE__, "Unexpected branch reached");
        break;
    }

    return result;
  }
  case TokenType::TOK_OP_NONE:
    return "( " + getLeft().toString() + ' ' + getRight().toString() + ')';
  default:
    return '(' + getOperatorToken().toString(getLexer()) + ' ' +
      getLeft().toString() + ' ' + getRight().toString() + ')';
  }
}